

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

bool __thiscall EventComparisonNode::Evaluate(EventComparisonNode *this,Date *date,string *event_to)

{
  string *event_to_local;
  Date *date_local;
  EventComparisonNode *this_local;
  
  switch(this->comp) {
  case Less:
    this_local._7_1_ = std::operator<(event_to,&this->event);
    break;
  case LessOrEqual:
    this_local._7_1_ = std::operator<=(event_to,&this->event);
    break;
  case Greater:
    this_local._7_1_ = std::operator>(event_to,&this->event);
    break;
  case GreaterOrEqual:
    this_local._7_1_ = std::operator>=(event_to,&this->event);
    break;
  case Equal:
    this_local._7_1_ = std::operator==(event_to,&this->event);
    break;
  case NotEqual:
    this_local._7_1_ = std::operator!=(event_to,&this->event);
    break;
  default:
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool EventComparisonNode::Evaluate(const Date &date, const string &event_to) const {
    switch (comp) {
        case Less:
            return event_to < event;
        case LessOrEqual:
            return event_to <= event;
        case Greater:
            return event_to > event;
        case GreaterOrEqual:
            return event_to >= event;
        case Equal:
            return event_to == event;
        case NotEqual:
            return event_to != event;
    }
    return true; // unreachable
}